

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O0

void __thiscall sf::Shader::bindTextures(Shader *this)

{
  _Rb_tree_const_iterator<std::pair<const_int,_const_sf::Texture_*>_> *p_Var1;
  pointer ppVar2;
  socklen_t __len;
  GLint index;
  size_t i;
  const_iterator it;
  map<int,_const_sf::Texture_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_sf::Texture_*>_>_>
  *in_stack_ffffffffffffffc8;
  PFNGLUNIFORM1IARBPROC p_Var3;
  _Rb_tree_const_iterator<std::pair<const_int,_const_sf::Texture_*>_> *this_00;
  _Rb_tree_const_iterator<std::pair<const_int,_const_sf::Texture_*>_> *local_18;
  
  std::
  map<int,_const_sf::Texture_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_sf::Texture_*>_>_>
  ::begin(in_stack_ffffffffffffffc8);
  local_18 = (_Rb_tree_const_iterator<std::pair<const_int,_const_sf::Texture_*>_> *)0x0;
  while( true ) {
    this_00 = local_18;
    p_Var1 = (_Rb_tree_const_iterator<std::pair<const_int,_const_sf::Texture_*>_> *)
             std::
             map<int,_const_sf::Texture_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_sf::Texture_*>_>_>
             ::size((map<int,_const_sf::Texture_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_sf::Texture_*>_>_>
                     *)0x2c88a2);
    if (p_Var1 <= this_00) break;
    p_Var3 = sf_glad_glUniform1iARB;
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_int,_const_sf::Texture_*>_>::operator->
                       ((_Rb_tree_const_iterator<std::pair<const_int,_const_sf::Texture_*>_> *)
                        0x2c88d4);
    (*p_Var3)(ppVar2->first,(int)local_18 + 1);
    (*sf_glad_glActiveTextureARB)((int)local_18 + 0x84c1);
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_int,_const_sf::Texture_*>_>::operator->
                       ((_Rb_tree_const_iterator<std::pair<const_int,_const_sf::Texture_*>_> *)
                        0x2c8903);
    Texture::bind((int)ppVar2->second,(sockaddr *)0x0,__len);
    std::_Rb_tree_const_iterator<std::pair<const_int,_const_sf::Texture_*>_>::operator++(this_00);
    local_18 = (_Rb_tree_const_iterator<std::pair<const_int,_const_sf::Texture_*>_> *)
               ((long)&local_18->_M_node + 1);
  }
  (*sf_glad_glActiveTextureARB)(0x84c0);
  return;
}

Assistant:

void Shader::bindTextures() const
{
    TextureTable::const_iterator it = m_textures.begin();
    for (std::size_t i = 0; i < m_textures.size(); ++i)
    {
        GLint index = static_cast<GLsizei>(i + 1);
        glCheck(GLEXT_glUniform1i(it->first, index));
        glCheck(GLEXT_glActiveTexture(GLEXT_GL_TEXTURE0 + static_cast<GLenum>(index)));
        Texture::bind(it->second);
        ++it;
    }

    // Make sure that the texture unit which is left active is the number 0
    glCheck(GLEXT_glActiveTexture(GLEXT_GL_TEXTURE0));
}